

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumeExponent(ParsedPatternInfo *this,UErrorCode *status)

{
  ParsedSubpatternInfo *pPVar1;
  UChar32 UVar2;
  ParsedSubpatternInfo *result;
  UErrorCode *status_local;
  ParsedPatternInfo *this_local;
  
  pPVar1 = this->currentSubpattern;
  UVar2 = ParserState::peek(&this->state);
  if (UVar2 == 0x45) {
    if ((pPVar1->groupingSizes & 0xffff0000) == 0xffff0000) {
      ParserState::next(&this->state);
      pPVar1->widthExceptAffixes = pPVar1->widthExceptAffixes + 1;
      UVar2 = ParserState::peek(&this->state);
      if (UVar2 == 0x2b) {
        ParserState::next(&this->state);
        pPVar1->exponentHasPlusSign = true;
        pPVar1->widthExceptAffixes = pPVar1->widthExceptAffixes + 1;
      }
      while (UVar2 = ParserState::peek(&this->state), UVar2 == 0x30) {
        ParserState::next(&this->state);
        pPVar1->exponentZeros = pPVar1->exponentZeros + 1;
        pPVar1->widthExceptAffixes = pPVar1->widthExceptAffixes + 1;
      }
    }
    else {
      ParserState::toParseException
                (&this->state,L"Cannot have grouping separator in scientific notation");
      *status = U_MALFORMED_EXPONENTIAL_PATTERN;
    }
  }
  return;
}

Assistant:

void ParsedPatternInfo::consumeExponent(UErrorCode& status) {
    // Convenience reference:
    ParsedSubpatternInfo& result = *currentSubpattern;

    if (state.peek() != u'E') {
        return;
    }
    if ((result.groupingSizes & 0xffff0000L) != 0xffff0000L) {
        state.toParseException(u"Cannot have grouping separator in scientific notation");
        status = U_MALFORMED_EXPONENTIAL_PATTERN;
        return;
    }
    state.next(); // consume the E
    result.widthExceptAffixes++;
    if (state.peek() == u'+') {
        state.next(); // consume the +
        result.exponentHasPlusSign = true;
        result.widthExceptAffixes++;
    }
    while (state.peek() == u'0') {
        state.next(); // consume the 0
        result.exponentZeros += 1;
        result.widthExceptAffixes++;
    }
}